

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_setpoint.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_setpoint::Reset(ChFunctionRotation_setpoint *this,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  this->S = s;
  dVar1 = DAT_00b68858;
  if (this != (ChFunctionRotation_setpoint *)&DAT_00b68838) {
    (this->Q).m_data[0] = QUNIT;
    (this->Q).m_data[1] = dVar1;
    dVar1 = DAT_00b68868;
    (this->Q).m_data[2] = DAT_00b68860;
    (this->Q).m_data[3] = dVar1;
  }
  (this->A).m_data[0] = 0.0;
  (this->A).m_data[1] = 0.0;
  (this->A).m_data[2] = 0.0;
  this->last_S = 0.0;
  (this->W).m_data[0] = 0.0;
  (this->W).m_data[1] = 0.0;
  (this->W).m_data[2] = 0.0;
  (this->A).m_data[0] = 0.0;
  dVar3 = DAT_00b68868;
  dVar2 = DAT_00b68860;
  dVar1 = DAT_00b68858;
  if (&this->last_Q != (ChQuaternion<double> *)&QUNIT) {
    (this->last_Q).m_data[0] = QUNIT;
    (this->last_Q).m_data[1] = dVar1;
    (this->last_Q).m_data[2] = dVar2;
    (this->last_Q).m_data[3] = dVar3;
  }
  (this->last_W).m_data[2] = 0.0;
  (this->last_W).m_data[0] = 0.0;
  (this->last_W).m_data[1] = 0.0;
  return;
}

Assistant:

void ChFunctionRotation_setpoint::Reset(double s) {
    S = s;
    Q = QUNIT;
    W = 0;
    A = 0;
    last_S = 0;
    last_Q = QUNIT;
    last_W = 0;
}